

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcReadVer.c
# Opt level: O0

int Wlc_PrsIsChar(char *pStr)

{
  undefined1 local_11;
  char *pStr_local;
  
  if (((((*pStr < 'a') || (local_11 = true, 'z' < *pStr)) &&
       ((*pStr < 'A' || (local_11 = true, 'Z' < *pStr)))) &&
      (((*pStr < '0' || (local_11 = true, '9' < *pStr)) && (local_11 = true, *pStr != '_')))) &&
     (local_11 = true, *pStr != '$')) {
    local_11 = *pStr == '\\';
  }
  return (int)local_11;
}

Assistant:

static inline int Wlc_PrsIsChar( char * pStr )
{
    return (pStr[0] >= 'a' && pStr[0] <= 'z') || 
           (pStr[0] >= 'A' && pStr[0] <= 'Z') || 
           (pStr[0] >= '0' && pStr[0] <= '9') || 
            pStr[0] == '_' || pStr[0] == '$' || pStr[0] == '\\';
}